

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O0

void __thiscall
ArgParser::add(ArgParser *this,uint *var,string *name,string *shortName,string *description,
              uint *validArgs,int nrValid,bool optional)

{
  uint *__last;
  uint *__first;
  size_type sVar1;
  reference pvVar2;
  allocator<unsigned_int> local_d1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d0;
  int local_b4;
  undefined1 local_b0 [4];
  int ind;
  string local_80;
  string local_60;
  byte local_39;
  uint *puStack_38;
  bool optional_local;
  uint *validArgs_local;
  string *description_local;
  string *shortName_local;
  string *name_local;
  uint *var_local;
  ArgParser *this_local;
  
  local_39 = optional;
  puStack_38 = validArgs;
  validArgs_local = (uint *)description;
  description_local = shortName;
  shortName_local = name;
  name_local = (string *)var;
  var_local = (uint *)this;
  std::__cxx11::string::string((string *)&local_60,(string *)name);
  std::__cxx11::string::string((string *)&local_80,(string *)shortName);
  std::__cxx11::string::string((string *)local_b0,(string *)description);
  add(this,var,&local_60,&local_80,(string *)local_b0,(bool)(local_39 & 1));
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  sVar1 = std::vector<ArgHolder,_std::allocator<ArgHolder>_>::size(&this->m_args);
  __first = puStack_38;
  local_b4 = (int)sVar1 + -1;
  __last = puStack_38 + nrValid;
  std::allocator<unsigned_int>::allocator(&local_d1);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d0,__first,__last,&local_d1
            );
  pvVar2 = std::vector<ArgHolder,_std::allocator<ArgHolder>_>::operator[]
                     (&this->m_args,(long)local_b4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&pvVar2->validUINT,&local_d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_d0);
  std::allocator<unsigned_int>::~allocator(&local_d1);
  pvVar2 = std::vector<ArgHolder,_std::allocator<ArgHolder>_>::operator[]
                     (&this->m_args,(long)local_b4);
  pvVar2->checkValid = true;
  return;
}

Assistant:

void ArgParser::add(unsigned int *var,
                    std::string name, std::string shortName, std::string description,
                    unsigned int validArgs[], int nrValid,
                    bool optional)
{
    add(var, name, shortName, description, optional);
    int ind = m_args.size() - 1;
    m_args[ind].validUINT = std::vector<unsigned int>(validArgs, validArgs+nrValid);
    m_args[ind].checkValid = true;
}